

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TrackRegistry::UpdateTrackImpl
          (TrackRegistry *this,Track track,
          function<void_(perfetto::protos::pbzero::TrackDescriptor_*)> *fill_function)

{
  TrackDescriptor *__args;
  undefined1 local_128 [8];
  string serialized_desc;
  undefined1 local_f8 [8];
  HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> new_descriptor;
  size_t kMaximumSliceSize;
  size_t kInitialSliceSize;
  function<void_(perfetto::protos::pbzero::TrackDescriptor_*)> *fill_function_local;
  TrackRegistry *this_local;
  Track track_local;
  
  new_descriptor.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = 0x1000;
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *)local_f8,0x20,0x1000);
  __args = protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::get
                     ((HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *)local_f8);
  std::function<void_(perfetto::protos::pbzero::TrackDescriptor_*)>::operator()
            (fill_function,__args);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::SerializeAsString_abi_cxx11_
            ((string *)local_128,(HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *)local_f8
            );
  UpdateTrack(this,track,(string *)local_128);
  ::std::__cxx11::string::~string((string *)local_128);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::~HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *)local_f8);
  return;
}

Assistant:

void TrackRegistry::UpdateTrackImpl(
    Track track,
    std::function<void(protos::pbzero::TrackDescriptor*)> fill_function) {
  constexpr size_t kInitialSliceSize = 32;
  constexpr size_t kMaximumSliceSize = 4096;
  protozero::HeapBuffered<protos::pbzero::TrackDescriptor> new_descriptor(
      kInitialSliceSize, kMaximumSliceSize);
  fill_function(new_descriptor.get());
  auto serialized_desc = new_descriptor.SerializeAsString();
  UpdateTrack(track, serialized_desc);
}